

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fkParentIsModified(Table *pTab,FKey *p,int *aChange,int bChngRowid)

{
  char *zRight;
  int iVar1;
  Column *pCol;
  int iKey;
  char *zKey;
  int i;
  int bChngRowid_local;
  int *aChange_local;
  FKey *p_local;
  Table *pTab_local;
  
  zKey._0_4_ = 0;
  do {
    if (p->nCol <= (int)zKey) {
      return 0;
    }
    zRight = p->aCol[(int)zKey].zCol;
    for (pCol._4_4_ = 0; pCol._4_4_ < pTab->nCol; pCol._4_4_ = pCol._4_4_ + 1) {
      if ((-1 < aChange[pCol._4_4_]) || ((pCol._4_4_ == pTab->iPKey && (bChngRowid != 0)))) {
        if (zRight == (char *)0x0) {
          if ((pTab->aCol[pCol._4_4_].colFlags & 1) != 0) {
            return 1;
          }
        }
        else {
          iVar1 = sqlite3StrICmp(pTab->aCol[pCol._4_4_].zName,zRight);
          if (iVar1 == 0) {
            return 1;
          }
        }
      }
    }
    zKey._0_4_ = (int)zKey + 1;
  } while( true );
}

Assistant:

static int fkParentIsModified(
  Table *pTab, 
  FKey *p, 
  int *aChange, 
  int bChngRowid
){
  int i;
  for(i=0; i<p->nCol; i++){
    char *zKey = p->aCol[i].zCol;
    int iKey;
    for(iKey=0; iKey<pTab->nCol; iKey++){
      if( aChange[iKey]>=0 || (iKey==pTab->iPKey && bChngRowid) ){
        Column *pCol = &pTab->aCol[iKey];
        if( zKey ){
          if( 0==sqlite3StrICmp(pCol->zName, zKey) ) return 1;
        }else if( pCol->colFlags & COLFLAG_PRIMKEY ){
          return 1;
        }
      }
    }
  }
  return 0;
}